

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChAssembly.cpp
# Opt level: O1

void __thiscall
chrono::ChAssembly::ShowHierarchy(ChAssembly *this,ChStreamOutAscii *m_file,int level)

{
  element_type *peVar1;
  pointer psVar2;
  pointer psVar3;
  pointer psVar4;
  pointer psVar5;
  element_type *peVar6;
  pointer psVar7;
  pointer psVar8;
  element_type *peVar9;
  ChStreamOutAscii *pCVar10;
  long lVar11;
  ChAssembly *this_00;
  int iVar12;
  shared_ptr<chrono::ChMarker> *marker;
  pointer psVar13;
  pointer psVar14;
  pointer psVar15;
  pointer psVar16;
  shared_ptr<chrono::ChShaft> *shaft;
  pointer psVar17;
  pointer psVar18;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var19;
  pointer psVar20;
  string mtabs;
  string local_60;
  pointer local_40;
  pointer local_38;
  
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  local_60._M_string_length = 0;
  local_60.field_2._M_local_buf[0] = '\0';
  if (0 < level) {
    iVar12 = level;
    do {
      std::__cxx11::string::append((char *)&local_60);
      iVar12 = iVar12 + -1;
    } while (iVar12 != 0);
  }
  pCVar10 = ChStreamOutAscii::operator<<(m_file,"\n");
  pCVar10 = ChStreamOutAscii::operator<<(pCVar10,&local_60);
  pCVar10 = ChStreamOutAscii::operator<<(pCVar10,"List of the ");
  pCVar10 = ChStreamOutAscii::operator<<
                      (pCVar10,(int)((ulong)((long)(this->bodylist).
                                                                                                      
                                                  super__Vector_base<std::shared_ptr<chrono::ChBody>,_std::allocator<std::shared_ptr<chrono::ChBody>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                            (long)(this->bodylist).
                                                  super__Vector_base<std::shared_ptr<chrono::ChBody>,_std::allocator<std::shared_ptr<chrono::ChBody>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 4));
  ChStreamOutAscii::operator<<(pCVar10," added rigid bodies: \n");
  psVar13 = (this->bodylist).
            super__Vector_base<std::shared_ptr<chrono::ChBody>,_std::allocator<std::shared_ptr<chrono::ChBody>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_38 = (this->bodylist).
             super__Vector_base<std::shared_ptr<chrono::ChBody>,_std::allocator<std::shared_ptr<chrono::ChBody>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar13 != local_38) {
    do {
      pCVar10 = ChStreamOutAscii::operator<<(m_file,&local_60);
      pCVar10 = ChStreamOutAscii::operator<<(pCVar10,"  BODY:       ");
      pCVar10 = ChStreamOutAscii::operator<<
                          (pCVar10,(((psVar13->
                                     super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)
                                    ._M_ptr)->super_ChPhysicsItem).super_ChObj.m_name._M_dataplus.
                                   _M_p);
      ChStreamOutAscii::operator<<(pCVar10,"\n");
      peVar1 = (psVar13->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      psVar2 = (peVar1->marklist).
               super__Vector_base<std::shared_ptr<chrono::ChMarker>,_std::allocator<std::shared_ptr<chrono::ChMarker>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      local_40 = psVar13;
      for (psVar14 = (peVar1->marklist).
                     super__Vector_base<std::shared_ptr<chrono::ChMarker>,_std::allocator<std::shared_ptr<chrono::ChMarker>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; psVar14 != psVar2;
          psVar14 = psVar14 + 1) {
        pCVar10 = ChStreamOutAscii::operator<<(m_file,&local_60);
        pCVar10 = ChStreamOutAscii::operator<<(pCVar10,"    MARKER:  ");
        pCVar10 = ChStreamOutAscii::operator<<
                            (pCVar10,(((psVar14->
                                       super___shared_ptr<chrono::ChMarker,_(__gnu_cxx::_Lock_policy)2>
                                       )._M_ptr)->super_ChObj).m_name._M_dataplus._M_p);
        ChStreamOutAscii::operator<<(pCVar10,"\n");
      }
      peVar1 = (local_40->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      psVar3 = (peVar1->forcelist).
               super__Vector_base<std::shared_ptr<chrono::ChForce>,_std::allocator<std::shared_ptr<chrono::ChForce>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (psVar15 = (peVar1->forcelist).
                     super__Vector_base<std::shared_ptr<chrono::ChForce>,_std::allocator<std::shared_ptr<chrono::ChForce>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; psVar15 != psVar3;
          psVar15 = psVar15 + 1) {
        pCVar10 = ChStreamOutAscii::operator<<(m_file,&local_60);
        pCVar10 = ChStreamOutAscii::operator<<(pCVar10,"    FORCE:  ");
        pCVar10 = ChStreamOutAscii::operator<<
                            (pCVar10,(((psVar15->
                                       super___shared_ptr<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2>
                                       )._M_ptr)->super_ChObj).m_name._M_dataplus._M_p);
        ChStreamOutAscii::operator<<(pCVar10,"\n");
      }
      psVar13 = local_40 + 1;
    } while (psVar13 != local_38);
  }
  pCVar10 = ChStreamOutAscii::operator<<(m_file,"\n");
  pCVar10 = ChStreamOutAscii::operator<<(pCVar10,&local_60);
  pCVar10 = ChStreamOutAscii::operator<<(pCVar10,"List of the ");
  pCVar10 = ChStreamOutAscii::operator<<
                      (pCVar10,(int)((ulong)((long)(this->shaftlist).
                                                                                                      
                                                  super__Vector_base<std::shared_ptr<chrono::ChShaft>,_std::allocator<std::shared_ptr<chrono::ChShaft>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                            (long)(this->shaftlist).
                                                  super__Vector_base<std::shared_ptr<chrono::ChShaft>,_std::allocator<std::shared_ptr<chrono::ChShaft>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 4));
  ChStreamOutAscii::operator<<(pCVar10," added shafts: \n");
  psVar17 = (this->shaftlist).
            super__Vector_base<std::shared_ptr<chrono::ChShaft>,_std::allocator<std::shared_ptr<chrono::ChShaft>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  psVar4 = (this->shaftlist).
           super__Vector_base<std::shared_ptr<chrono::ChShaft>,_std::allocator<std::shared_ptr<chrono::ChShaft>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar17 != psVar4) {
    do {
      pCVar10 = ChStreamOutAscii::operator<<(m_file,&local_60);
      pCVar10 = ChStreamOutAscii::operator<<(pCVar10,"  SHAFT:      ");
      pCVar10 = ChStreamOutAscii::operator<<
                          (pCVar10,(((psVar17->
                                     super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>
                                     )._M_ptr)->super_ChPhysicsItem).super_ChObj.m_name._M_dataplus.
                                   _M_p);
      ChStreamOutAscii::operator<<(pCVar10,"\n");
      psVar17 = psVar17 + 1;
    } while (psVar17 != psVar4);
  }
  pCVar10 = ChStreamOutAscii::operator<<(m_file,"\n");
  pCVar10 = ChStreamOutAscii::operator<<(pCVar10,&local_60);
  pCVar10 = ChStreamOutAscii::operator<<(pCVar10,"List of the ");
  pCVar10 = ChStreamOutAscii::operator<<
                      (pCVar10,(int)((ulong)((long)(this->linklist).
                                                                                                      
                                                  super__Vector_base<std::shared_ptr<chrono::ChLinkBase>,_std::allocator<std::shared_ptr<chrono::ChLinkBase>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                            (long)(this->linklist).
                                                  super__Vector_base<std::shared_ptr<chrono::ChLinkBase>,_std::allocator<std::shared_ptr<chrono::ChLinkBase>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 4));
  ChStreamOutAscii::operator<<(pCVar10," added links: \n");
  psVar16 = (this->linklist).
            super__Vector_base<std::shared_ptr<chrono::ChLinkBase>,_std::allocator<std::shared_ptr<chrono::ChLinkBase>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  psVar5 = (this->linklist).
           super__Vector_base<std::shared_ptr<chrono::ChLinkBase>,_std::allocator<std::shared_ptr<chrono::ChLinkBase>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar16 != psVar5) {
    do {
      pCVar10 = ChStreamOutAscii::operator<<(m_file,&local_60);
      pCVar10 = ChStreamOutAscii::operator<<(pCVar10,"  LINK:       ");
      pCVar10 = ChStreamOutAscii::operator<<
                          (pCVar10,(((psVar16->
                                     super___shared_ptr<chrono::ChLinkBase,_(__gnu_cxx::_Lock_policy)2>
                                     )._M_ptr)->super_ChPhysicsItem).super_ChObj.m_name._M_dataplus.
                                   _M_p);
      pCVar10 = ChStreamOutAscii::operator<<(pCVar10," [");
      pCVar10 = ChStreamOutAscii::operator<<(pCVar10,"PN6chrono10ChLinkBaseE");
      ChStreamOutAscii::operator<<(pCVar10,"]\n");
      peVar6 = (psVar16->super___shared_ptr<chrono::ChLinkBase,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      if (peVar6 == (element_type *)0x0) {
        lVar11 = 0;
      }
      else {
        lVar11 = __dynamic_cast(peVar6,&ChLinkBase::typeinfo,&ChLinkMarkers::typeinfo,0);
      }
      if (lVar11 == 0) {
        lVar11 = 0;
        p_Var19 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      }
      else {
        p_Var19 = (psVar16->super___shared_ptr<chrono::ChLinkBase,_(__gnu_cxx::_Lock_policy)2>).
                  _M_refcount._M_pi;
        if (p_Var19 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var19->_M_use_count = p_Var19->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var19->_M_use_count = p_Var19->_M_use_count + 1;
          }
        }
      }
      if (lVar11 != 0) {
        if (*(long *)(lVar11 + 0xb8) != 0) {
          pCVar10 = ChStreamOutAscii::operator<<(m_file,&local_60);
          pCVar10 = ChStreamOutAscii::operator<<(pCVar10,"    marker1:  ");
          pCVar10 = ChStreamOutAscii::operator<<(pCVar10,*(char **)(*(long *)(lVar11 + 0xb8) + 8));
          ChStreamOutAscii::operator<<(pCVar10,"\n");
        }
        if (*(long *)(lVar11 + 0xc0) != 0) {
          pCVar10 = ChStreamOutAscii::operator<<(m_file,&local_60);
          pCVar10 = ChStreamOutAscii::operator<<(pCVar10,"    marker2:  ");
          pCVar10 = ChStreamOutAscii::operator<<(pCVar10,*(char **)(*(long *)(lVar11 + 0xc0) + 8));
          ChStreamOutAscii::operator<<(pCVar10,"\n");
        }
      }
      if (p_Var19 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var19);
      }
      psVar16 = psVar16 + 1;
    } while (psVar16 != psVar5);
  }
  pCVar10 = ChStreamOutAscii::operator<<(m_file,"\n");
  pCVar10 = ChStreamOutAscii::operator<<(pCVar10,&local_60);
  pCVar10 = ChStreamOutAscii::operator<<(pCVar10,"List of the ");
  pCVar10 = ChStreamOutAscii::operator<<
                      (pCVar10,(int)((ulong)((long)(this->meshlist).
                                                                                                      
                                                  super__Vector_base<std::shared_ptr<chrono::fea::ChMesh>,_std::allocator<std::shared_ptr<chrono::fea::ChMesh>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                            (long)(this->meshlist).
                                                  super__Vector_base<std::shared_ptr<chrono::fea::ChMesh>,_std::allocator<std::shared_ptr<chrono::fea::ChMesh>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 4));
  ChStreamOutAscii::operator<<(pCVar10," added meshes: \n");
  psVar18 = (this->meshlist).
            super__Vector_base<std::shared_ptr<chrono::fea::ChMesh>,_std::allocator<std::shared_ptr<chrono::fea::ChMesh>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  psVar7 = (this->meshlist).
           super__Vector_base<std::shared_ptr<chrono::fea::ChMesh>,_std::allocator<std::shared_ptr<chrono::fea::ChMesh>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar18 != psVar7) {
    do {
      pCVar10 = ChStreamOutAscii::operator<<(m_file,&local_60);
      pCVar10 = ChStreamOutAscii::operator<<(pCVar10,"  MESH :      ");
      pCVar10 = ChStreamOutAscii::operator<<
                          (pCVar10,(((psVar18->
                                     super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>
                                     )._M_ptr)->super_ChIndexedNodes).super_ChPhysicsItem.
                                   super_ChObj.m_name._M_dataplus._M_p);
      ChStreamOutAscii::operator<<(pCVar10,"\n");
      psVar18 = psVar18 + 1;
    } while (psVar18 != psVar7);
  }
  pCVar10 = ChStreamOutAscii::operator<<(m_file,"\n");
  pCVar10 = ChStreamOutAscii::operator<<(pCVar10,&local_60);
  pCVar10 = ChStreamOutAscii::operator<<(pCVar10,"List of other ");
  pCVar10 = ChStreamOutAscii::operator<<
                      (pCVar10,(int)((ulong)((long)(this->otherphysicslist).
                                                                                                      
                                                  super__Vector_base<std::shared_ptr<chrono::ChPhysicsItem>,_std::allocator<std::shared_ptr<chrono::ChPhysicsItem>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                            (long)(this->otherphysicslist).
                                                  super__Vector_base<std::shared_ptr<chrono::ChPhysicsItem>,_std::allocator<std::shared_ptr<chrono::ChPhysicsItem>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 4));
  ChStreamOutAscii::operator<<(pCVar10," added physic items: \n");
  psVar20 = (this->otherphysicslist).
            super__Vector_base<std::shared_ptr<chrono::ChPhysicsItem>,_std::allocator<std::shared_ptr<chrono::ChPhysicsItem>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  psVar8 = (this->otherphysicslist).
           super__Vector_base<std::shared_ptr<chrono::ChPhysicsItem>,_std::allocator<std::shared_ptr<chrono::ChPhysicsItem>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar20 != psVar8) {
    do {
      pCVar10 = ChStreamOutAscii::operator<<(m_file,&local_60);
      pCVar10 = ChStreamOutAscii::operator<<(pCVar10,"  PHYSIC ITEM: ");
      pCVar10 = ChStreamOutAscii::operator<<
                          (pCVar10,(((psVar20->
                                     super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>
                                     )._M_ptr)->super_ChObj).m_name._M_dataplus._M_p);
      pCVar10 = ChStreamOutAscii::operator<<(pCVar10," [");
      pCVar10 = ChStreamOutAscii::operator<<(pCVar10,"PN6chrono13ChPhysicsItemE");
      ChStreamOutAscii::operator<<(pCVar10,"]\n");
      peVar9 = (psVar20->super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      if (peVar9 == (element_type *)0x0) {
        this_00 = (ChAssembly *)0x0;
      }
      else {
        this_00 = (ChAssembly *)__dynamic_cast(peVar9,&ChPhysicsItem::typeinfo,&typeinfo,0);
      }
      if (this_00 == (ChAssembly *)0x0) {
        this_00 = (ChAssembly *)0x0;
        p_Var19 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      }
      else {
        p_Var19 = (psVar20->super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>).
                  _M_refcount._M_pi;
        if (p_Var19 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var19->_M_use_count = p_Var19->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var19->_M_use_count = p_Var19->_M_use_count + 1;
          }
        }
      }
      if (this_00 != (ChAssembly *)0x0) {
        ShowHierarchy(this_00,m_file,level + 1);
      }
      if (p_Var19 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var19);
      }
      psVar20 = psVar20 + 1;
    } while (psVar20 != psVar8);
  }
  ChStreamOutAscii::operator<<(m_file,"\n\n");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,
                    CONCAT71(local_60.field_2._M_allocated_capacity._1_7_,
                             local_60.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void ChAssembly::ShowHierarchy(ChStreamOutAscii& m_file, int level) const {
    std::string mtabs;
    for (int i = 0; i < level; ++i)
        mtabs += "  ";

    m_file << "\n" << mtabs << "List of the " << (int)bodylist.size() << " added rigid bodies: \n";
    for (auto& body : bodylist) {
        m_file << mtabs << "  BODY:       " << body->GetName() << "\n";

        for (auto& marker : body->GetMarkerList()) {
            m_file << mtabs << "    MARKER:  " << marker->GetName() << "\n";
        }

        for (auto& force : body->GetForceList()) {
            m_file << mtabs << "    FORCE:  " << force->GetName() << "\n";
        }
    }

    m_file << "\n" << mtabs << "List of the " << (int)shaftlist.size() << " added shafts: \n";
    for (auto& shaft : shaftlist) {
        m_file << mtabs << "  SHAFT:      " << shaft->GetName() << "\n";
    }

    m_file << "\n" << mtabs << "List of the " << (int)linklist.size() << " added links: \n";
    for (auto& link : linklist) {
        m_file << mtabs << "  LINK:       " << link->GetName() << " [" << typeid(link.get()).name() << "]\n";
        if (auto malink = std::dynamic_pointer_cast<ChLinkMarkers>(link)) {
            if (malink->GetMarker1())
                m_file << mtabs << "    marker1:  " << malink->GetMarker1()->GetName() << "\n";
            if (malink->GetMarker2())
                m_file << mtabs << "    marker2:  " << malink->GetMarker2()->GetName() << "\n";
        }
    }

    m_file << "\n" << mtabs << "List of the " << (int)meshlist.size() << " added meshes: \n";
    for (auto& mesh : meshlist) {
        m_file << mtabs << "  MESH :      " << mesh->GetName() << "\n";
    }

    m_file << "\n" << mtabs << "List of other " << (int)otherphysicslist.size() << " added physic items: \n";
    for (auto& item : otherphysicslist) {
        m_file << mtabs << "  PHYSIC ITEM: " << item->GetName() << " [" << typeid(item.get()).name() << "]\n";

        // recursion:
        if (auto assem = std::dynamic_pointer_cast<ChAssembly>(item))
            assem->ShowHierarchy(m_file, level + 1);
    }

    m_file << "\n\n";
}